

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamANCF_3243::ComputeNF
          (ChElementBeamANCF_3243 *this,double xi,double eta,double zeta,ChVectorDynamic<> *Qi,
          double *detJ,ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  Scalar SVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  XprTypeNested pMVar7;
  scalar_constant_op<double> sVar8;
  scalar_constant_op<double> sVar9;
  Scalar *pSVar10;
  Scalar *pSVar11;
  long index;
  uint i;
  long index_00;
  Scalar SVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ChMatrix33<double> J_Cxi_Inv;
  ChVectorN<double,_3> M_scaled;
  VectorN G_C;
  VectorN G_B;
  Map<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_0,_Eigen::Stride<0,_0>_> QiReshaped;
  VectorN G_A;
  VectorN Sxi_compact;
  ChMatrix33<double> J_Cxi;
  MatrixNx3c Sxi_D;
  Matrix3xN e_bar;
  MatrixNx3 QiCompact;
  Matrix<double,_3,_3,_1,_3,_3> local_890;
  undefined1 local_848 [16];
  XprTypeNested pMStack_838;
  variable_if_dynamic<long,__1> vStack_830;
  variable_if_dynamic<long,__1> vStack_828;
  Index IStack_820;
  scalar_constant_op<double> local_810;
  BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true> local_800;
  BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true> local_7c0;
  BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true> local_780;
  BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true> local_740;
  PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>> local_700 [8];
  PointerType local_6f8;
  XprTypeNested pMStack_6f0;
  XprTypeNested pMStack_6e8;
  long lStack_6e0;
  Index IStack_6d8;
  XprTypeNested pMStack_6d0;
  undefined1 local_6c0 [16];
  XprTypeNested pMStack_6b0;
  variable_if_dynamic<long,__1> vStack_6a8;
  variable_if_dynamic<long,__1> vStack_6a0;
  Index IStack_698;
  Index IStack_690;
  PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>> local_680 [8];
  PointerType pdStack_678;
  double dStack_670;
  XprTypeNested local_668;
  long lStack_660;
  long lStack_658;
  XprTypeNested pMStack_650;
  BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true> local_620;
  Matrix<double,_8,_3,_1,_8,_3> *local_5d8 [2];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
  local_5c8;
  undefined1 local_580 [16];
  XprTypeNested pMStack_570;
  variable_if_dynamic<long,__1> vStack_568;
  variable_if_dynamic<long,__1> vStack_560;
  XprTypeNested pMStack_558;
  scalar_constant_op<double> local_548;
  undefined1 local_538 [24];
  scalar_constant_op<double> sStack_520;
  XprTypeNested local_518;
  variable_if_dynamic<long,__1> vStack_510;
  double dStack_508;
  XprTypeNested pMStack_500;
  double local_4f0;
  PointerType local_4e0;
  XprTypeNested pMStack_4d8;
  XprTypeNested pMStack_4d0;
  long lStack_4c8;
  Index IStack_4c0;
  Index IStack_4b8;
  double local_4a8;
  PointerType local_490;
  undefined8 uStack_488;
  XprTypeNested pMStack_480;
  long lStack_478;
  long lStack_470;
  Index IStack_468;
  double local_458;
  PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>> local_440 [64];
  Matrix<double,_3,_3,_1,_3,_3> local_400;
  PointerType local_3a0;
  PointerType pdStack_398;
  XprTypeNested pMStack_390;
  XprTypeNested pMStack_388;
  long lStack_380;
  Index IStack_378;
  XprTypeNested pMStack_370;
  Matrix<double,_3,_3,_1,_3,_3> local_348;
  MatrixNx3c local_300;
  BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true> local_230;
  Matrix3xN local_200;
  Matrix<double,_8,_3,_1,_8,_3> local_140;
  
  Calc_Sxi_compact(this,(VectorN *)&local_400,xi,eta,zeta);
  index = 0;
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_200,F,0,3);
  local_538._0_8_ = &local_400;
  vStack_510.m_value =
       (long)local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_8,_1,_3,_8>_>.m_storage.m_data
             .array[4];
  dStack_508 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_8,_1,_3,_8>_>.m_storage.
               m_data.array[5];
  pMStack_500 = (XprTypeNested)
                local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_8,_1,_3,_8>_>.m_storage.
                m_data.array[6];
  local_538._8_8_ =
       local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_8,_1,_3,_8>_>.m_storage.m_data.array
       [0];
  local_538._16_8_ =
       local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_8,_1,_3,_8>_>.m_storage.m_data.array
       [1];
  sStack_520.m_other =
       local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_8,_1,_3,_8>_>.m_storage.m_data.array
       [2];
  local_518 = (XprTypeNested)
              local_200.super_PlainObjectBase<Eigen::Matrix<double,_3,_8,_1,_3,_8>_>.m_storage.
              m_data.array[3];
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,8,3,1,8,3>,Eigen::Product<Eigen::Matrix<double,8,1,0,8,1>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>const>,0>>
            (&local_140,
             (Product<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_0>
              *)local_538);
  local_5d8[0] = &local_140;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Map<Eigen::Matrix<double,24,1,0,24,1>,0,Eigen::Stride<0,0>>>
            (Qi,(Map<Eigen::Matrix<double,_24,_1,_0,_24,_1>,_0,_Eigen::Stride<0,_0>_> *)local_5d8);
  CalcCoordMatrix(this,&local_200);
  Calc_Sxi_D(this,&local_300,xi,eta,zeta);
  local_538._0_8_ = &local_200;
  local_890.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_348;
  local_538._8_8_ = &local_300;
  Eigen::NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase> *)&local_890,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_8,_1,_3,_8>,_Eigen::Matrix<double,_8,_3,_0,_8,_3>,_0>_>
              *)local_538);
  local_538._0_8_ = &local_348;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Inverse<Eigen::Matrix<double,3,3,1,3,3>>>
            (&local_890,(Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_538);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true> *)
                  local_6c0,&local_300,0);
  lStack_380 = vStack_6a0.m_value;
  IStack_378 = IStack_698;
  local_3a0 = (PointerType)local_6c0._0_8_;
  pdStack_398 = (PointerType)local_6c0._8_8_;
  pMStack_390 = pMStack_6b0;
  pMStack_388 = (XprTypeNested)vStack_6a8.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,0,8,3>,8,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
             *)local_580,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,0,8,3>,8,1,true>>> *)
            &local_3a0,(double *)&local_890);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true>::
  BlockImpl_dense(&local_780,&local_300,1);
  local_740.m_startCol.m_value = local_780.m_startCol.m_value;
  local_740.m_outerStride = local_780.m_outerStride;
  local_740.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>.m_data =
       local_780.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>.m_data;
  local_740.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>._8_8_ =
       local_780.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>._8_8_;
  local_740.m_xpr = local_780.m_xpr;
  local_740.m_startRow.m_value = local_780.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,0,8,3>,8,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
             *)local_848,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,0,8,3>,8,1,true>>> *)
            &local_740,
            local_890.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array + 3);
  sVar9.m_other = local_548.m_other;
  sVar8.m_other = local_810.m_other;
  lStack_658 = vStack_560.m_value;
  pMStack_650 = pMStack_558;
  local_6f8 = (PointerType)local_848._0_8_;
  pMStack_6f0 = (XprTypeNested)local_848._8_8_;
  pdStack_678 = (PointerType)local_580._0_8_;
  dStack_670 = (double)local_580._8_8_;
  local_668 = pMStack_570;
  lStack_660 = vStack_568.m_value;
  pMStack_6e8 = pMStack_838;
  lStack_6e0 = vStack_830.m_value;
  IStack_6d8 = vStack_828.m_value;
  pMStack_6d0 = (XprTypeNested)IStack_820;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true>::
  BlockImpl_dense(&local_800,&local_300,2);
  local_7c0.m_startCol.m_value = local_800.m_startCol.m_value;
  local_7c0.m_outerStride = local_800.m_outerStride;
  local_7c0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>.m_data =
       local_800.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>.m_data;
  local_7c0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>._8_8_ =
       local_800.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>._8_8_;
  local_7c0.m_xpr = local_800.m_xpr;
  local_7c0.m_startRow.m_value = local_800.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,0,8,3>,8,1,true>>>::
  operator*(&local_5c8,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,0,8,3>,8,1,true>>> *)
            &local_7c0,
            local_890.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array + 6);
  dStack_508 = (double)lStack_658;
  pMStack_500 = pMStack_650;
  local_538._16_8_ = pdStack_678;
  sStack_520.m_other = dStack_670;
  local_518 = local_668;
  vStack_510.m_value = lStack_660;
  local_4f0 = sVar9.m_other;
  local_4e0 = local_6f8;
  pMStack_4d8 = pMStack_6f0;
  pMStack_4d0 = pMStack_6e8;
  lStack_4c8 = lStack_6e0;
  IStack_4c0 = IStack_6d8;
  IStack_4b8 = (Index)pMStack_6d0;
  local_4a8 = sVar8.m_other;
  local_490 = local_5c8.m_lhs.m_matrix.
              super_BlockImpl<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>.
              m_data;
  uStack_488 = local_5c8.m_lhs.m_matrix.
               super_BlockImpl<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>.
               _8_8_;
  pMStack_480 = local_5c8.m_lhs.m_matrix.
                super_BlockImpl<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_Eigen::Dense>.
                super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true>.m_xpr;
  lStack_478 = local_5c8.m_lhs.m_matrix.
               super_BlockImpl<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true>.
               m_startRow.m_value;
  lStack_470 = local_5c8.m_lhs.m_matrix.
               super_BlockImpl<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true>.
               m_startCol.m_value;
  IStack_468 = local_5c8.m_lhs.m_matrix.
               super_BlockImpl<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true>.
               m_outerStride;
  local_458 = local_5c8.m_rhs.m_functor.m_other;
  Eigen::PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,0,8,3>,8,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,0,8,3>,8,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,0,8,3>,8,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const>>
            (local_440,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>_>_>
              *)local_538);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true>::
  BlockImpl_dense(&local_740,&local_300,0);
  vStack_6a0.m_value = local_740.m_startCol.m_value;
  IStack_698 = local_740.m_outerStride;
  local_6c0._0_8_ =
       local_740.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>.m_data;
  local_6c0._8_8_ =
       local_740.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>._8_8_;
  pMStack_6b0 = local_740.m_xpr;
  vStack_6a8.m_value = local_740.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,0,8,3>,8,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
             *)local_580,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,0,8,3>,8,1,true>>> *)
            local_6c0,
            local_890.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array + 1);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true>::
  BlockImpl_dense(&local_7c0,&local_300,1);
  local_780.m_startCol.m_value = local_7c0.m_startCol.m_value;
  local_780.m_outerStride = local_7c0.m_outerStride;
  local_780.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>.m_data =
       local_7c0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>.m_data;
  local_780.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>._8_8_ =
       local_7c0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>._8_8_;
  local_780.m_xpr = local_7c0.m_xpr;
  local_780.m_startRow.m_value = local_7c0.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,0,8,3>,8,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
             *)local_848,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,0,8,3>,8,1,true>>> *)
            &local_780,
            local_890.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array + 4);
  sVar9.m_other = local_548.m_other;
  sVar8.m_other = local_810.m_other;
  IStack_6d8 = vStack_560.m_value;
  pMStack_6d0 = pMStack_558;
  pdStack_398 = (PointerType)local_848._0_8_;
  pMStack_390 = (XprTypeNested)local_848._8_8_;
  local_6f8 = (PointerType)local_580._0_8_;
  pMStack_6f0 = (XprTypeNested)local_580._8_8_;
  pMStack_6e8 = pMStack_570;
  lStack_6e0 = vStack_568.m_value;
  pMStack_388 = pMStack_838;
  lStack_380 = vStack_830.m_value;
  IStack_378 = vStack_828.m_value;
  pMStack_370 = (XprTypeNested)IStack_820;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true>::
  BlockImpl_dense(&local_620,&local_300,2);
  local_800.m_startCol.m_value = local_620.m_startCol.m_value;
  local_800.m_outerStride = local_620.m_outerStride;
  local_800.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>.m_data =
       local_620.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>.m_data;
  local_800.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>._8_8_ =
       local_620.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>._8_8_;
  local_800.m_xpr = local_620.m_xpr;
  local_800.m_startRow.m_value = local_620.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,0,8,3>,8,1,true>>>::
  operator*(&local_5c8,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,0,8,3>,8,1,true>>> *)
            &local_800,
            local_890.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array + 7);
  dStack_508 = (double)IStack_6d8;
  pMStack_500 = pMStack_6d0;
  local_538._16_8_ = local_6f8;
  sStack_520.m_other = (double)pMStack_6f0;
  local_518 = pMStack_6e8;
  vStack_510.m_value = lStack_6e0;
  local_4f0 = sVar9.m_other;
  local_4e0 = pdStack_398;
  pMStack_4d8 = pMStack_390;
  pMStack_4d0 = pMStack_388;
  lStack_4c8 = lStack_380;
  IStack_4c0 = IStack_378;
  IStack_4b8 = (Index)pMStack_370;
  local_4a8 = sVar8.m_other;
  local_490 = local_5c8.m_lhs.m_matrix.
              super_BlockImpl<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>.
              m_data;
  uStack_488 = local_5c8.m_lhs.m_matrix.
               super_BlockImpl<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>.
               _8_8_;
  pMStack_480 = local_5c8.m_lhs.m_matrix.
                super_BlockImpl<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_Eigen::Dense>.
                super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true>.m_xpr;
  lStack_478 = local_5c8.m_lhs.m_matrix.
               super_BlockImpl<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true>.
               m_startRow.m_value;
  lStack_470 = local_5c8.m_lhs.m_matrix.
               super_BlockImpl<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true>.
               m_startCol.m_value;
  IStack_468 = local_5c8.m_lhs.m_matrix.
               super_BlockImpl<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true>.
               m_outerStride;
  local_458 = local_5c8.m_rhs.m_functor.m_other;
  Eigen::PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,0,8,3>,8,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,0,8,3>,8,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,0,8,3>,8,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const>>
            (local_680,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>_>_>
              *)local_538);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true>::
  BlockImpl_dense(&local_780,&local_300,0);
  local_740.m_startCol.m_value = local_780.m_startCol.m_value;
  local_740.m_outerStride = local_780.m_outerStride;
  local_740.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>.m_data =
       local_780.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>.m_data;
  local_740.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>._8_8_ =
       local_780.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>._8_8_;
  local_740.m_xpr = local_780.m_xpr;
  local_740.m_startRow.m_value = local_780.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,0,8,3>,8,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
             *)local_580,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,0,8,3>,8,1,true>>> *)
            &local_740,
            local_890.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array + 2);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true>::
  BlockImpl_dense(&local_800,&local_300,1);
  local_7c0.m_startCol.m_value = local_800.m_startCol.m_value;
  local_7c0.m_outerStride = local_800.m_outerStride;
  local_7c0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>.m_data =
       local_800.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>.m_data;
  local_7c0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>._8_8_ =
       local_800.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>._8_8_;
  local_7c0.m_xpr = local_800.m_xpr;
  local_7c0.m_startRow.m_value = local_800.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,0,8,3>,8,1,true>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
             *)local_848,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,0,8,3>,8,1,true>>> *)
            &local_7c0,
            local_890.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array + 5);
  IStack_378 = vStack_560.m_value;
  pMStack_370 = pMStack_558;
  local_6c0._8_8_ = local_848._0_8_;
  pMStack_6b0 = (XprTypeNested)local_848._8_8_;
  pdStack_398 = (PointerType)local_580._0_8_;
  pMStack_390 = (XprTypeNested)local_580._8_8_;
  pMStack_388 = pMStack_570;
  lStack_380 = vStack_568.m_value;
  vStack_6a8.m_value = (long)pMStack_838;
  vStack_6a0.m_value = vStack_830.m_value;
  IStack_698 = vStack_828.m_value;
  IStack_690 = IStack_820;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true>::
  BlockImpl_dense(&local_230,&local_300,2);
  local_620.m_startCol.m_value = local_230.m_startCol.m_value;
  local_620.m_outerStride = local_230.m_outerStride;
  local_620.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>.m_data =
       local_230.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>.m_data;
  local_620.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>._8_8_ =
       local_230.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>._8_8_;
  local_620.m_xpr = local_230.m_xpr;
  local_620.m_startRow.m_value = local_230.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,0,8,3>,8,1,true>>>::
  operator*(&local_5c8,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,0,8,3>,8,1,true>>> *)
            &local_620,
            local_890.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array + 8);
  dStack_508 = (double)IStack_378;
  pMStack_500 = pMStack_370;
  local_538._16_8_ = pdStack_398;
  sStack_520.m_other = (double)pMStack_390;
  local_518 = pMStack_388;
  vStack_510.m_value = lStack_380;
  local_4f0 = local_548.m_other;
  local_4e0 = (PointerType)local_6c0._8_8_;
  pMStack_4d8 = pMStack_6b0;
  pMStack_4d0 = (XprTypeNested)vStack_6a8.m_value;
  lStack_4c8 = vStack_6a0.m_value;
  IStack_4c0 = IStack_698;
  IStack_4b8 = IStack_690;
  local_4a8 = local_810.m_other;
  local_490 = local_5c8.m_lhs.m_matrix.
              super_BlockImpl<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>.
              m_data;
  uStack_488 = local_5c8.m_lhs.m_matrix.
               super_BlockImpl<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>.
               _8_8_;
  pMStack_480 = local_5c8.m_lhs.m_matrix.
                super_BlockImpl<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_Eigen::Dense>.
                super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true>.m_xpr;
  lStack_478 = local_5c8.m_lhs.m_matrix.
               super_BlockImpl<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true>.
               m_startRow.m_value;
  lStack_470 = local_5c8.m_lhs.m_matrix.
               super_BlockImpl<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true>.
               m_startCol.m_value;
  IStack_468 = local_5c8.m_lhs.m_matrix.
               super_BlockImpl<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true>.
               m_outerStride;
  local_458 = local_5c8.m_rhs.m_functor.m_other;
  Eigen::PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,0,8,3>,8,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,0,8,3>,8,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,0,8,3>,8,1,true>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const>>
            (local_700,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>_>_>
              *)local_538);
  local_5c8.m_lhs.m_matrix.
  super_BlockImpl<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_0,_8,_3>,_8,_1,_true>,_0>.m_data =
       (PointerType)0x3fe0000000000000;
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_580,F,3,3);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                    *)local_538,(double *)&local_5c8,(StorageBaseType *)local_580);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_848,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>_>
              *)local_538);
  for (index_00 = 0; uVar5 = local_848._8_8_, index_00 != 8; index_00 = index_00 + 1) {
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1> *)local_700,
                         index_00);
    pMVar7 = pMStack_838;
    SVar1 = *pSVar10;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1> *)local_680,
                         index_00);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = SVar1;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar5;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = (double)pMVar7 * *pSVar10;
    auVar2 = vfmsub231sd_fma(auVar16,auVar13,auVar2);
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,index);
    pMVar7 = pMStack_838;
    *pSVar11 = auVar2._0_8_ + *pSVar11;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1> *)local_440,
                         index_00);
    uVar5 = local_848._0_8_;
    SVar1 = *pSVar10;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1> *)local_700,
                         index_00);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = SVar1;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = pMVar7;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = (double)uVar5 * *pSVar10;
    auVar2 = vfmsub231sd_fma(auVar17,auVar14,auVar3);
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,index + 1)
    ;
    uVar5 = local_848._0_8_;
    *pSVar11 = auVar2._0_8_ + *pSVar11;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1> *)local_680,
                         index_00);
    uVar6 = local_848._8_8_;
    SVar1 = *pSVar10;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1> *)local_440,
                         index_00);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = SVar1;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar5;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = (double)uVar6 * *pSVar10;
    auVar2 = vfmsub231sd_fma(auVar18,auVar15,auVar4);
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,index + 2)
    ;
    index = index + 3;
    *pSVar11 = auVar2._0_8_ + *pSVar11;
  }
  SVar12 = Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3>::run
                     (&local_348);
  *detJ = SVar12;
  return;
}

Assistant:

void ChElementBeamANCF_3243::ComputeNF(
    const double xi,             // parametric coordinate in volume
    const double eta,            // parametric coordinate in volume
    const double zeta,           // parametric coordinate in volume
    ChVectorDynamic<>& Qi,       // Return result of N'*F  here, maybe with offset block_offset
    double& detJ,                // Return det[J] here
    const ChVectorDynamic<>& F,  // Input F vector, size is = n.field coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
) {
    // Compute the generalized force vector for the applied force component using the compact form of the shape
    // functions.  This requires a reshaping of the calculated matrix to get it into the correct vector order (just a
    // reinterpretation of the data since the matrix is in row-major format)
    VectorN Sxi_compact;
    Calc_Sxi_compact(Sxi_compact, xi, eta, zeta);
    MatrixNx3 QiCompact;

    QiCompact = Sxi_compact * F.segment(0, 3).transpose();

    Eigen::Map<Vector3N> QiReshaped(QiCompact.data(), QiCompact.size());
    Qi = QiReshaped;

    // Compute the generalized force vector for the applied moment component
    // See: Antonio M Recuero, Javier F Aceituno, Jose L Escalona, and Ahmed A Shabana.
    // A nonlinear approach for modeling rail flexibility using the absolute nodal coordinate
    // formulation. Nonlinear Dynamics, 83(1-2):463-481, 2016.

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    MatrixNx3c Sxi_D;
    Calc_Sxi_D(Sxi_D, xi, eta, zeta);

    ChMatrix33<double> J_Cxi;
    ChMatrix33<double> J_Cxi_Inv;

    J_Cxi.noalias() = e_bar * Sxi_D;
    J_Cxi_Inv = J_Cxi.inverse();

    // Compute the unique pieces that make up the moment projection matrix "G"
    VectorN G_A = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 0) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 0) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 0);
    VectorN G_B = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 1) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 1) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 1);
    VectorN G_C = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 2) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 2) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 2);

    ChVectorN<double, 3> M_scaled = 0.5 * F.segment(3, 3);

    // Compute G'M without actually forming the complete matrix "G" (since it has a sparsity pattern to it)
    for (unsigned int i = 0; i < NSF; i++) {
        Qi(3 * i) += M_scaled(1) * G_C(i) - M_scaled(2) * G_B(i);
        Qi((3 * i) + 1) += M_scaled(2) * G_A(i) - M_scaled(0) * G_C(i);
        Qi((3 * i) + 2) += M_scaled(0) * G_B(i) - M_scaled(1) * G_A(i);
    }

    // Compute the element Jacobian between the current configuration and the normalized configuration
    // This is different than the element Jacobian between the reference configuration and the normalized
    //  configuration used in the internal force calculations.  For this calculation, this is the ratio between the
    //  actual differential volume and the normalized differential volume.  The determinate of the element Jacobian is
    //  used to calculate this volume ratio for potential use in Gauss-Quadrature or similar numeric integration.
    detJ = J_Cxi.determinant();
}